

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5ApiQueryToken(Fts5Context *pCtx,int iPhrase,int iToken,char **ppOut,int *pnOut)

{
  long lVar1;
  int iVar2;
  
  iVar2 = 0x19;
  if ((((-1 < iPhrase) && (iPhrase < *(int *)(*(long *)(pCtx + 0x40) + 0x1c))) && (-1 < iToken)) &&
     (lVar1 = *(long *)(*(long *)(*(long *)(pCtx + 0x40) + 0x20) + (ulong)(uint)iPhrase * 8),
     iToken < *(int *)(lVar1 + 0x18))) {
    *ppOut = *(char **)(lVar1 + 0x28 + (ulong)(uint)iToken * 0x28);
    *pnOut = *(int *)(lVar1 + 0x34 + (ulong)(uint)iToken * 0x28);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int fts5ApiQueryToken(
  Fts5Context* pCtx,
  int iPhrase,
  int iToken,
  const char **ppOut,
  int *pnOut
){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  return sqlite3Fts5ExprQueryToken(pCsr->pExpr, iPhrase, iToken, ppOut, pnOut);
}